

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

string * chaiscript::exception::eval_error::format_filename
                   (string *__return_storage_ptr__,string *t_fname)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  bVar1 = std::operator!=(t_fname,"__EVAL__");
  poVar2 = local_188;
  if (bVar1) {
    poVar2 = std::operator<<(poVar2,"in \'");
    poVar2 = std::operator<<(poVar2,(string *)t_fname);
    pcVar3 = "\' ";
  }
  else {
    pcVar3 = "during evaluation ";
  }
  std::operator<<(poVar2,pcVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

static std::string format_filename(const std::string &t_fname)
      {
        std::stringstream ss;

        if (t_fname != "__EVAL__")
        {
          ss << "in '" << t_fname << "' ";
        } else {
          ss << "during evaluation ";
        }

        return ss.str();
      }